

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O0

vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *
dpfb::readKerningPairsGpos
          (vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
           *__return_storage_ptr__,Stream *stream,SfntOffsetTable *sfntOffsetTable,
          KerningParams *params)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t tag;
  StreamError *this;
  undefined1 local_a0 [8];
  LookupContext ctx;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lookupIndices;
  uint16_t lookupListOffset;
  uint16_t featureListOffset;
  string local_50 [34];
  ushort local_2e;
  uint32_t local_2c;
  uint16_t versionMajor;
  KerningParams *pKStack_28;
  uint32_t tableOffset;
  KerningParams *params_local;
  SfntOffsetTable *sfntOffsetTable_local;
  Stream *stream_local;
  
  pKStack_28 = params;
  params_local = (KerningParams *)sfntOffsetTable;
  sfntOffsetTable_local = (SfntOffsetTable *)stream;
  stream_local = (Stream *)__return_storage_ptr__;
  tag = sfntTag('G','P','O','S');
  local_2c = SfntOffsetTable::getTableOffset(sfntOffsetTable,tag);
  if (local_2c == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::vector
              (__return_storage_ptr__);
  }
  else {
    (*(code *)(sfntOffsetTable_local->tableRecords).
              super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
              ._M_impl.super__Vector_impl_data._M_start[7])(sfntOffsetTable_local,local_2c,0);
    local_2e = streams::Stream::readU16Be((Stream *)sfntOffsetTable_local);
    if (local_2e != 1) {
      this = (StreamError *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                ((char *)local_50,"Unsupported \"GPOS\" major version %u",(ulong)local_2e);
      streams::StreamError::runtime_error(this,local_50);
      __cxa_throw(this,&streams::StreamError::typeinfo,streams::StreamError::~StreamError);
    }
    (*(code *)(sfntOffsetTable_local->tableRecords).
              super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
              ._M_impl.super__Vector_impl_data._M_start[7])();
    (*(code *)(sfntOffsetTable_local->tableRecords).
              super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
              ._M_impl.super__Vector_impl_data._M_start[7])(sfntOffsetTable_local,2,1);
    uVar1 = streams::Stream::readU16Be((Stream *)sfntOffsetTable_local);
    uVar2 = streams::Stream::readU16Be((Stream *)sfntOffsetTable_local);
    getAllKernFeatures((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       &ctx.kerningPairs.
                        super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Stream *)sfntOffsetTable_local,local_2c + uVar1);
    LookupContext::LookupContext((LookupContext *)local_a0);
    local_a0._0_4_ = pKStack_28->pxSize;
    local_a0._4_4_ = getScale(pKStack_28);
    lookupFeatures((Stream *)sfntOffsetTable_local,local_2c + uVar2,(LookupContext *)local_a0,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   &ctx.kerningPairs.
                    super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>::vector
              (__return_storage_ptr__,
               (vector<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_> *)&ctx);
    LookupContext::~LookupContext((LookupContext *)local_a0);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &ctx.kerningPairs.
                super__Vector_base<dpfb::RawKerningPair,_std::allocator<dpfb::RawKerningPair>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<RawKerningPair> readKerningPairsGpos(
    Stream& stream,
    const SfntOffsetTable& sfntOffsetTable,
    const KerningParams& params)
{
    const auto tableOffset = sfntOffsetTable.getTableOffset(
        sfntTag('G', 'P', 'O', 'S'));
    if (tableOffset == 0)
        return {};

    stream.seek(tableOffset, SeekOrigin::set);

    const auto versionMajor = stream.readU16Be();
    if (versionMajor != 1)
        throw StreamError(str::format(
            "Unsupported \"GPOS\" major version %" PRIu16,
            versionMajor));
    // Skip minor version
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);

    // Skip scriptListOffset
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);
    const auto featureListOffset = stream.readU16Be();
    const auto lookupListOffset = stream.readU16Be();

    const auto lookupIndices = getAllKernFeatures(
        stream, tableOffset + featureListOffset);

    LookupContext ctx;
    ctx.pxSize = params.pxSize;
    ctx.scale = getScale(params);
    lookupFeatures(
        stream, tableOffset + lookupListOffset, ctx, lookupIndices);

    return std::move(ctx.kerningPairs);
}